

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O3

void __thiscall UDPSplitPacketReader::SplitPacket::SplitPacket(SplitPacket *this,int size)

{
  buf_t *pbVar1;
  ulong uVar2;
  
  *(undefined ***)&this->field_0x48 = &PTR___cxa_pure_virtual_00116d70;
  (this->super_BufferReader).super_Buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00115eb0;
  uVar2 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar2 = (long)size;
  }
  pbVar1 = (buf_t *)operator_new__(uVar2);
  (this->super_BufferReader).super_Buffer.buf_current = pbVar1;
  (this->super_BufferReader).super_Buffer.buf_start = pbVar1;
  (this->super_BufferReader).super_Buffer.buf_end = pbVar1 + size;
  (this->super_BufferReader).read_end = pbVar1;
  (this->super_BufferReader).super_Buffer._vptr_Buffer = (_func_int **)0x116c88;
  *(undefined8 *)&this->field_0x48 = 0x116cc0;
  *(undefined8 *)&(this->super_BufferReader).field_0x28 = 0;
  (this->previous)._M_node = (_List_node_base *)0x0;
  *(undefined8 *)((long)&(this->previous)._M_node + 4) = 0;
  *(undefined8 *)((long)&(this->start)._M_node + 4) = 0;
  return;
}

Assistant:

UDPSplitPacketReader::SplitPacket::SplitPacket(int size) : BufferReader(size) {
  hasNext = hasPrevious = hasStart = hasEnd = false;
}